

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitExecAllocator.c
# Opt level: O0

void * sljit_malloc_exec(sljit_uw size)

{
  block_header *pbVar1;
  sljit_uw sVar2;
  ulong size_00;
  ulong *puVar3;
  free_block *free_block_00;
  block_header *local_38;
  sljit_uw chunk_size;
  free_block *free_block;
  block_header *next_header;
  block_header *header;
  sljit_uw size_local;
  
  allocator_grab_lock();
  header = (block_header *)size;
  if (size < 0x30) {
    header = (block_header *)0x30;
  }
  pbVar1 = (block_header *)((ulong)((long)&header[1].size + 7U) & 0xfffffffffffffff8);
  chunk_size = (sljit_uw)free_blocks;
  while( true ) {
    if (chunk_size == 0) {
      size_00 = (ulong)((long)&pbVar1[0x1000].prev_size + 7U) & 0xffffffffffff0000;
      puVar3 = (ulong *)alloc_chunk(size_00);
      if (puVar3 == (ulong *)0x0) {
        allocator_release_lock();
        size_local = 0;
      }
      else {
        local_38 = (block_header *)(size_00 - 0x10);
        total_size = (long)&local_38->size + total_size;
        puVar3[1] = 0;
        if (pbVar1 + 4 < local_38) {
          allocated_size = (long)&pbVar1->size + allocated_size;
          *puVar3 = (ulong)pbVar1;
          local_38 = (block_header *)((long)local_38 - (long)pbVar1);
          free_block_00 = (free_block *)((long)puVar3 + (long)pbVar1);
          (free_block_00->header).prev_size = (sljit_uw)pbVar1;
          sljit_insert_free_block(free_block_00,(sljit_uw)local_38);
          free_block = (free_block *)((long)free_block_00 + (long)local_38);
        }
        else {
          allocated_size = (long)&local_38->size + allocated_size;
          *puVar3 = (ulong)local_38;
          free_block = (free_block *)((long)puVar3 + (long)local_38);
        }
        (free_block->header).size = 1;
        (free_block->header).prev_size = (sljit_uw)local_38;
        allocator_release_lock();
        size_local = (sljit_uw)(puVar3 + 2);
      }
      return (void *)size_local;
    }
    if (pbVar1 <= *(block_header **)(chunk_size + 0x20)) break;
    chunk_size = *(sljit_uw *)(chunk_size + 0x10);
  }
  header = *(block_header **)(chunk_size + 0x20);
  if (pbVar1 + 4 < header) {
    sVar2 = (long)header - (long)pbVar1;
    *(sljit_uw *)(chunk_size + 0x20) = sVar2;
    next_header = (block_header *)(chunk_size + sVar2);
    next_header->prev_size = sVar2;
    *(block_header **)((long)&next_header->prev_size + (long)pbVar1) = pbVar1;
    header = pbVar1;
  }
  else {
    sljit_remove_free_block((free_block *)chunk_size);
    next_header = (block_header *)chunk_size;
  }
  allocated_size = (long)&header->size + allocated_size;
  next_header->size = (sljit_uw)header;
  allocator_release_lock();
  return next_header + 1;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE void* sljit_malloc_exec(sljit_uw size)
{
	struct block_header *header;
	struct block_header *next_header;
	struct free_block *free_block;
	sljit_uw chunk_size;

	allocator_grab_lock();
	if (size < (64 - sizeof(struct block_header)))
		size = (64 - sizeof(struct block_header));
	size = ALIGN_SIZE(size);

	free_block = free_blocks;
	while (free_block) {
		if (free_block->size >= size) {
			chunk_size = free_block->size;
			if (chunk_size > size + 64) {
				/* We just cut a block from the end of the free block. */
				chunk_size -= size;
				free_block->size = chunk_size;
				header = AS_BLOCK_HEADER(free_block, chunk_size);
				header->prev_size = chunk_size;
				AS_BLOCK_HEADER(header, size)->prev_size = size;
			}
			else {
				sljit_remove_free_block(free_block);
				header = (struct block_header*)free_block;
				size = chunk_size;
			}
			allocated_size += size;
			header->size = size;
			allocator_release_lock();
			return MEM_START(header);
		}
		free_block = free_block->next;
	}

	chunk_size = (size + sizeof(struct block_header) + CHUNK_SIZE - 1) & CHUNK_MASK;
	header = (struct block_header*)alloc_chunk(chunk_size);
	if (!header) {
		allocator_release_lock();
		return NULL;
	}

	chunk_size -= sizeof(struct block_header);
	total_size += chunk_size;

	header->prev_size = 0;
	if (chunk_size > size + 64) {
		/* Cut the allocated space into a free and a used block. */
		allocated_size += size;
		header->size = size;
		chunk_size -= size;

		free_block = AS_FREE_BLOCK(header, size);
		free_block->header.prev_size = size;
		sljit_insert_free_block(free_block, chunk_size);
		next_header = AS_BLOCK_HEADER(free_block, chunk_size);
	}
	else {
		/* All space belongs to this allocation. */
		allocated_size += chunk_size;
		header->size = chunk_size;
		next_header = AS_BLOCK_HEADER(header, chunk_size);
	}
	next_header->size = 1;
	next_header->prev_size = chunk_size;
	allocator_release_lock();
	return MEM_START(header);
}